

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssxmlExporter.cpp
# Opt level: O3

void Assimp::AssxmlExport::ConvertName(aiString *out,aiString *in)

{
  byte bVar1;
  uint uVar2;
  char *app;
  ulong uVar3;
  
  out->length = 0;
  if (in->length == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      bVar1 = in->data[uVar3];
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          app = "&quot;";
          goto LAB_0030a4ce;
        }
        if (bVar1 == 0x26) {
          app = "&amp;";
          goto LAB_0030a4ce;
        }
LAB_0030a4e0:
        uVar2 = out->length;
        out->length = uVar2 + 1;
        out->data[uVar2] = bVar1;
      }
      else {
        if (bVar1 == 0x27) {
          app = "&apos;";
        }
        else if (bVar1 == 0x3e) {
          app = "&gt;";
        }
        else {
          if (bVar1 != 0x3c) goto LAB_0030a4e0;
          app = "&lt;";
        }
LAB_0030a4ce:
        aiString::Append(out,app);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < in->length);
    uVar3 = (ulong)out->length;
  }
  out->data[uVar3] = '\0';
  return;
}

Assistant:

static void ConvertName(aiString& out, const aiString& in) {
    out.length = 0;
    for (unsigned int i = 0; i < in.length; ++i)  {
        switch (in.data[i]) {
            case '<':
                out.Append("&lt;");break;
            case '>':
                out.Append("&gt;");break;
            case '&':
                out.Append("&amp;");break;
            case '\"':
                out.Append("&quot;");break;
            case '\'':
                out.Append("&apos;");break;
            default:
                out.data[out.length++] = in.data[i];
        }
    }
    out.data[out.length] = 0;
}